

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte *pbVar5;
  pointer pDVar6;
  long lVar7;
  size_t size;
  
  if (this->len == 0) {
    pbVar5 = (byte *)0x0;
  }
  else {
    size = this->len * 0x20;
    pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar5 + size) {
      pbVar5 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
      if (this->len == 0) goto LAB_003be452;
      pDVar6 = this->data_;
      size = this->len << 5;
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar5 + size;
      pDVar6 = this->data_;
    }
    lVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pDVar6->value + lVar7);
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      uVar4 = puVar1[3];
      *(undefined8 *)(pbVar5 + lVar7 + 0x10) = puVar1[2];
      *(undefined8 *)(pbVar5 + lVar7 + 0x10 + 8) = uVar4;
      *(undefined8 *)(pbVar5 + lVar7) = uVar2;
      *(undefined8 *)(pbVar5 + lVar7 + 8) = uVar3;
      lVar7 = lVar7 + 0x20;
    } while (puVar1 + 4 != (undefined8 *)((long)&pDVar6->value + size));
    if (this->len != 0 && pbVar5 == (byte *)0x0) {
      std::terminate();
    }
  }
LAB_003be452:
  return (int)pbVar5;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }